

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GRULayerParams::InternalSwap(GRULayerParams *this,GRULayerParams *other)

{
  GRULayerParams *other_local;
  GRULayerParams *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(other->activations_).super_RepeatedPtrFieldBase);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->updategateweightmatrix_,&other->updategateweightmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->resetgateweightmatrix_,&other->resetgateweightmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->outputgateweightmatrix_,&other->outputgateweightmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->updategaterecursionmatrix_,&other->updategaterecursionmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->resetgaterecursionmatrix_,&other->resetgaterecursionmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->outputgaterecursionmatrix_,&other->outputgaterecursionmatrix_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->updategatebiasvector_,&other->updategatebiasvector_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->resetgatebiasvector_,&other->resetgatebiasvector_);
  std::swap<CoreML::Specification::WeightParams*>
            (&this->outputgatebiasvector_,&other->outputgatebiasvector_);
  std::swap<unsigned_long>(&this->inputvectorsize_,&other->inputvectorsize_);
  std::swap<unsigned_long>(&this->outputvectorsize_,&other->outputvectorsize_);
  std::swap<bool>(&this->sequenceoutput_,&other->sequenceoutput_);
  std::swap<bool>(&this->hasbiasvectors_,&other->hasbiasvectors_);
  std::swap<bool>(&this->reverseinput_,&other->reverseinput_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void GRULayerParams::InternalSwap(GRULayerParams* other) {
  activations_.InternalSwap(&other->activations_);
  std::swap(updategateweightmatrix_, other->updategateweightmatrix_);
  std::swap(resetgateweightmatrix_, other->resetgateweightmatrix_);
  std::swap(outputgateweightmatrix_, other->outputgateweightmatrix_);
  std::swap(updategaterecursionmatrix_, other->updategaterecursionmatrix_);
  std::swap(resetgaterecursionmatrix_, other->resetgaterecursionmatrix_);
  std::swap(outputgaterecursionmatrix_, other->outputgaterecursionmatrix_);
  std::swap(updategatebiasvector_, other->updategatebiasvector_);
  std::swap(resetgatebiasvector_, other->resetgatebiasvector_);
  std::swap(outputgatebiasvector_, other->outputgatebiasvector_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(sequenceoutput_, other->sequenceoutput_);
  std::swap(hasbiasvectors_, other->hasbiasvectors_);
  std::swap(reverseinput_, other->reverseinput_);
  std::swap(_cached_size_, other->_cached_size_);
}